

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_stringbuilder.cpp
# Opt level: O2

bool __thiscall
icu_63::number::impl::NumberStringBuilder::contentEquals
          (NumberStringBuilder *this,NumberStringBuilder *other)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ValueOrHeapArray<UNumberFormatFields> *pVVar6;
  ValueOrHeapArray<char16_t> *pVVar7;
  ValueOrHeapArray<UNumberFormatFields> *pVVar8;
  ValueOrHeapArray<char16_t> *pVVar9;
  bool bVar10;
  
  uVar3 = this->fLength;
  uVar4 = 0;
  if (uVar3 == other->fLength) {
    bVar10 = (this->fUsingHeap & 1U) != 0;
    pVVar7 = &this->fChars;
    if (bVar10) {
      pVVar7 = (ValueOrHeapArray<char16_t> *)(this->fChars).heap.ptr;
    }
    pVVar8 = &this->fFields;
    if (bVar10) {
      pVVar8 = (ValueOrHeapArray<UNumberFormatFields> *)(this->fFields).heap.ptr;
    }
    bVar10 = (other->fUsingHeap & 1U) != 0;
    pVVar9 = &other->fChars;
    if (bVar10) {
      pVVar9 = (ValueOrHeapArray<char16_t> *)(other->fChars).heap.ptr;
    }
    pVVar6 = &other->fFields;
    if (bVar10) {
      pVVar6 = (ValueOrHeapArray<UNumberFormatFields> *)(other->fFields).heap.ptr;
    }
    uVar5 = 0;
    if (0 < (int)uVar3) {
      uVar5 = (ulong)uVar3;
    }
    do {
      if (uVar5 == uVar4) {
        uVar4 = (ulong)((long)(int)uVar3 <= (long)uVar4);
        goto LAB_00265073;
      }
    } while ((*(short *)((long)pVVar7 + uVar4 * 2 + (long)this->fZero * 2) ==
              *(short *)((long)pVVar9 + uVar4 * 2 + (long)other->fZero * 2)) &&
            (lVar1 = uVar4 * 4, lVar2 = uVar4 * 4, uVar4 = uVar4 + 1,
            *(int *)((long)pVVar8 + lVar1 + (long)this->fZero * 4) ==
            *(int *)((long)pVVar6 + lVar2 + (long)other->fZero * 4)));
    uVar4 = 0;
  }
LAB_00265073:
  return SUB81(uVar4,0);
}

Assistant:

bool NumberStringBuilder::contentEquals(const NumberStringBuilder &other) const {
    if (fLength != other.fLength) {
        return false;
    }
    for (int32_t i = 0; i < fLength; i++) {
        if (charAt(i) != other.charAt(i) || fieldAt(i) != other.fieldAt(i)) {
            return false;
        }
    }
    return true;
}